

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O2

void __thiscall QFileSystemModelPrivate::~QFileSystemModelPrivate(QFileSystemModelPrivate *this)

{
  __pid_t _Var1;
  
  *(undefined ***)this = &PTR__QFileSystemModelPrivate_0078beb8;
  QFileInfoGatherer::requestAbort
            ((QFileInfoGatherer *)
             (this->fileInfoGatherer)._M_t.
             super___uniq_ptr_impl<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>._M_t.
             super__Tuple_impl<0UL,_QFileInfoGatherer_*,_std::default_delete<QFileInfoGatherer>_>.
             super__Head_base<0UL,_QFileInfoGatherer_*,_false>._M_head_impl);
  _Var1 = QThread::wait(&((this->fileInfoGatherer)._M_t.
                          super___uniq_ptr_impl<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_QFileInfoGatherer_*,_std::default_delete<QFileInfoGatherer>_>
                          .super__Head_base<0UL,_QFileInfoGatherer_*,_false>._M_head_impl)->
                         super_QThread,(void *)0x3e8);
  if ((char)_Var1 == '\0') {
    (this->fileInfoGatherer)._M_t.
    super___uniq_ptr_impl<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>._M_t.
    super__Tuple_impl<0UL,_QFileInfoGatherer_*,_std::default_delete<QFileInfoGatherer>_>.
    super__Head_base<0UL,_QFileInfoGatherer_*,_false>._M_head_impl = (QFileInfoGatherer *)0x0;
    QObject::deleteLater();
  }
  QBasicTimer::~QBasicTimer(&this->fetchingTimer);
  QArrayDataPointer<QFileSystemModelPrivate::Fetching>::~QArrayDataPointer(&(this->toFetch).d);
  QFileSystemNode::~QFileSystemNode(&this->root);
  QHash<QString,_QString>::~QHash(&this->resolvedSymLinks);
  std::vector<QRegularExpression,_std::allocator<QRegularExpression>_>::~vector
            (&this->nameFiltersRegexps);
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->nameFilters).d);
  QHash<const_QFileSystemModelPrivate::QFileSystemNode_*,_bool>::~QHash(&this->bypassFilters);
  QTimer::~QTimer(&this->delayedSortTimer);
  std::unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>::~unique_ptr
            (&this->fileInfoGatherer);
  QDir::~QDir(&this->rootDir);
  QAbstractItemModelPrivate::~QAbstractItemModelPrivate(&this->super_QAbstractItemModelPrivate);
  return;
}

Assistant:

QFileSystemModelPrivate::~QFileSystemModelPrivate()
{
#if QT_CONFIG(filesystemwatcher)
    fileInfoGatherer->requestAbort();
    if (!fileInfoGatherer->wait(1000)) {
        // If the thread hangs, perhaps because the network was disconnected
        // while the gatherer was stat'ing a remote file, then don't block
        // shutting down the model (which might block a file dialog and the
        // main thread). Schedule the gatherer for later deletion; it's
        // destructor will wait for the thread to finish.
        auto *rawGatherer = fileInfoGatherer.release();
        rawGatherer->deleteLater();
    }
#endif // filesystemwatcher
}